

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratorContextImpl::WriteAllToDisk
          (GeneratorContextImpl *this,string *prefix)

{
  int __errnum;
  pointer pcVar1;
  lts_20250127 *plVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  reference __rhs;
  int *piVar6;
  ssize_t sVar7;
  ostream *poVar8;
  char *pcVar9;
  uint uVar10;
  int error;
  pointer __buf;
  ulong uVar11;
  iterator iVar12;
  string_view sp;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  iterator local_70;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
  local_60;
  ByAnyChar local_50;
  
  if (this->had_error_ == false) {
    if ((prefix->_M_string_length == 0) ||
       (iVar4 = access((prefix->_M_dataplus)._M_p,0), iVar4 != -1)) {
      iVar12 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                        *)&this->files_);
      local_60.node_ =
           (btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            *)iVar12.node_;
      local_60.position_ = iVar12.position_;
      iVar12 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                      *)&this->files_);
      local_70.node_ = iVar12.node_;
      local_70.position_ = iVar12.position_;
      do {
        bVar3 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                ::operator!=(&local_60,&local_70);
        if (!bVar3) {
LAB_00137dc0:
          return !bVar3;
        }
        __rhs = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
                ::operator*(&local_60);
        __buf = (__rhs->second)._M_dataplus._M_p;
        uVar10 = (uint)(__rhs->second)._M_string_length;
        pcVar1 = (__rhs->first)._M_dataplus._M_p;
        plVar2 = (lts_20250127 *)(__rhs->first)._M_string_length;
        sp._M_str = "/\\";
        sp._M_len = 2;
        absl::lts_20250127::ByAnyChar::ByAnyChar(&local_50,sp);
        absl::lts_20250127::StrSplit<absl::lts_20250127::ByAnyChar,absl::lts_20250127::SkipEmpty>
                  ((Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                    *)&filename,plVar2,pcVar1,&local_50);
        absl::lts_20250127::strings_internal::
        Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::
        operator_vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                  (&parts,(Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&filename);
        std::__cxx11::string::~string((string *)filename.field_2._M_local_buf);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&filename,(string *)prefix);
        for (uVar11 = 0;
            uVar11 < ((long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U;
            uVar11 = uVar11 + 1) {
          std::__cxx11::string::append((string *)&filename);
          iVar4 = mkdir(filename._M_dataplus._M_p,0x1ff);
          if ((iVar4 != 0) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
            poVar8 = std::operator<<((ostream *)&std::cerr,(string *)__rhs);
            poVar8 = std::operator<<(poVar8,": while trying to create directory ");
            poVar8 = std::operator<<(poVar8,(string *)&filename);
            poVar8 = std::operator<<(poVar8,": ");
            pcVar9 = strerror(*piVar6);
            poVar8 = std::operator<<(poVar8,pcVar9);
            std::endl<char,std::char_traits<char>>(poVar8);
            std::__cxx11::string::~string((string *)&filename);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&parts);
            goto LAB_00137dc0;
          }
          std::__cxx11::string::push_back
                    ((char)(Splitter<absl::lts_20250127::ByAnyChar,_absl::lts_20250127::SkipEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)&filename);
        }
        std::__cxx11::string::~string((string *)&filename);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&parts);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filename,prefix,&__rhs->first);
        while (iVar4 = open(filename._M_dataplus._M_p,0x241,0x1b6), iVar4 < 0) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          if (iVar4 != 4) {
            poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
            poVar8 = std::operator<<(poVar8,": ");
            pcVar9 = strerror(iVar4);
            std::operator<<(poVar8,pcVar9);
            goto LAB_00137db2;
          }
        }
        for (; 0 < (int)uVar10; uVar10 = uVar10 - uVar5) {
          while( true ) {
            sVar7 = write(iVar4,__buf,(ulong)uVar10);
            uVar5 = (uint)sVar7;
            if (-1 < (int)uVar5) break;
            piVar6 = __errno_location();
            __errnum = *piVar6;
            if (__errnum != 4) {
              poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
              poVar8 = std::operator<<(poVar8,": write: ");
              pcVar9 = strerror(__errnum);
              std::operator<<(poVar8,pcVar9);
              goto LAB_00137db2;
            }
          }
          if (uVar5 == 0) {
            poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
            poVar8 = std::operator<<(poVar8,": write() returned zero?");
            std::endl<char,std::char_traits<char>>(poVar8);
            goto LAB_00137db2;
          }
          __buf = __buf + (uVar5 & 0x7fffffff);
        }
        iVar4 = close(iVar4);
        if (iVar4 != 0) {
          piVar6 = __errno_location();
          iVar4 = *piVar6;
          poVar8 = std::operator<<((ostream *)&std::cerr,(string *)&filename);
          poVar8 = std::operator<<(poVar8,": close: ");
          pcVar9 = strerror(iVar4);
          std::operator<<(poVar8,pcVar9);
LAB_00137db2:
          std::__cxx11::string::~string((string *)&filename);
          goto LAB_00137dc0;
        }
        std::__cxx11::string::~string((string *)&filename);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*>
        ::increment(&local_60);
      } while( true );
    }
    poVar8 = std::operator<<((ostream *)&std::cerr,(string *)prefix);
    poVar8 = std::operator<<(poVar8,": ");
    piVar6 = __errno_location();
    pcVar9 = strerror(*piVar6);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  return false;
}

Assistant:

bool CommandLineInterface::GeneratorContextImpl::WriteAllToDisk(
    const std::string& prefix) {
  if (had_error_) {
    return false;
  }

  if (!VerifyDirectoryExists(prefix)) {
    return false;
  }

  for (const auto& pair : files_) {
    const std::string& relative_filename = pair.first;
    const char* data = pair.second.data();
    int size = pair.second.size();

    if (!TryCreateParentDirectory(prefix, relative_filename)) {
      return false;
    }
    std::string filename = prefix + relative_filename;

    // Create the output file.
    int file_descriptor;
    do {
      file_descriptor =
          open(filename.c_str(), O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
    } while (file_descriptor < 0 && errno == EINTR);

    if (file_descriptor < 0) {
      int error = errno;
      std::cerr << filename << ": " << strerror(error);
      return false;
    }

    // Write the file.
    while (size > 0) {
      int write_result;
      do {
        write_result = write(file_descriptor, data, size);
      } while (write_result < 0 && errno == EINTR);

      if (write_result <= 0) {
        // Write error.

        // FIXME(kenton):  According to the man page, if write() returns zero,
        //   there was no error; write() simply did not write anything.  It's
        //   unclear under what circumstances this might happen, but presumably
        //   errno won't be set in this case.  I am confused as to how such an
        //   event should be handled.  For now I'm treating it as an error,
        //   since retrying seems like it could lead to an infinite loop.  I
        //   suspect this never actually happens anyway.

        if (write_result < 0) {
          int error = errno;
          std::cerr << filename << ": write: " << strerror(error);
        } else {
          std::cerr << filename << ": write() returned zero?" << std::endl;
        }
        return false;
      }

      data += write_result;
      size -= write_result;
    }

    if (close(file_descriptor) != 0) {
      int error = errno;
      std::cerr << filename << ": close: " << strerror(error);
      return false;
    }
  }

  return true;
}